

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::replace_trackers
          (torrent *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *urls)

{
  node_ptr plVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  
  tracker_list::replace(&this->m_trackers,urls);
  iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  bVar2 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar3),0x8013);
  if (bVar2) {
    tracker_list::prioritize_udp_trackers(&this->m_trackers);
  }
  if (((this->field_0x5c0 & 0x40) != 0) &&
     (plVar1 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.
               next_,
     plVar1 != &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node
     && plVar1 != (node_ptr)0x0)) {
    announce_with_tracker(this,none);
  }
  set_need_save_resume(this,(resume_data_flags_t)0x80);
  return;
}

Assistant:

void torrent::replace_trackers(std::vector<lt::announce_entry> const& urls)
	{
		m_trackers.replace(urls);

		if (settings().get_bool(settings_pack::prefer_udp_trackers))
			m_trackers.prioritize_udp_trackers();

		if (m_announcing && !m_trackers.empty()) announce_with_tracker();

		set_need_save_resume(torrent_handle::if_metadata_changed);
	}